

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O1

void __thiscall ixy::IxgbeDevice::init_tx(IxgbeDevice *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  dma_memory dVar4;
  dma_memory mem;
  undefined1 local_c2 [10];
  undefined1 local_b8 [4];
  undefined4 uStack_b4;
  vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_> *local_b0;
  void *local_a8;
  undefined1 local_a0 [32];
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  
  if (0x423f < this->len - 4) {
    if ((0x423f < this->len - 4) &&
       (*(uint *)(this->addr + 0x4240) = *(uint *)(this->addr + 0x4240) | 0x401,
       0xcbff < this->len - 4)) {
      puVar1 = this->addr;
      puVar1[0xcc00] = '\0';
      puVar1[0xcc01] = 0xa0;
      puVar1[0xcc02] = '\0';
      puVar1[0xcc03] = '\0';
      uVar2 = 0xcc04;
      do {
        if (this->len - 4 < uVar2) goto LAB_001072ab;
        puVar1 = this->addr + uVar2;
        puVar1[0] = '\0';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        uVar2 = uVar2 + 4;
      } while (uVar2 != 0xcc20);
      if (0x80ff < this->len - 4) {
        puVar1 = this->addr;
        puVar1[0x8100] = 0xff;
        puVar1[0x8101] = 0xff;
        puVar1[0x8102] = '\0';
        puVar1[0x8103] = '\0';
        if (this->len - 4 < 0x4900) goto LAB_001072ca;
        if (0x48ff < this->len - 4) {
          *(uint *)(this->addr + 0x4900) = *(uint *)(this->addr + 0x4900) & 0xffffffbf;
          local_c2._0_2_ = 0;
          if (this->num_tx_queues != 0) {
            local_b0 = &this->tx_queues;
            do {
              local_a0._8_8_ = "initializing tx queue ";
              local_a0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c2;
              debug<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>>
                        ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                         ,0xc6,"init_tx",
                         (LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>_>
                          *)local_a0);
              dVar4 = memory_allocate_dma(0x2000,true);
              unique0x100004f5 = dVar4;
              memset(dVar4.virt,0xff,0x2000);
              uVar2 = (ulong)(ushort)local_c2._0_2_ * 0x40 + 0x6000;
              if (this->len - 4 < uVar2) goto LAB_001072ab;
              *(int *)(this->addr + uVar2) = (int)dVar4.phy;
              uVar2 = (ulong)(ushort)local_c2._0_2_ * 0x40 + 0x6004;
              if (this->len - 4 < uVar2) goto LAB_001072ab;
              *(undefined4 *)(this->addr + uVar2) = uStack_b4;
              uVar2 = (ulong)(ushort)local_c2._0_2_ * 0x40 + 0x6008;
              if (this->len - 4 < uVar2) goto LAB_001072ab;
              puVar1 = this->addr + uVar2;
              puVar1[0] = '\0';
              puVar1[1] = ' ';
              puVar1[2] = '\0';
              puVar1[3] = '\0';
              local_a0._8_8_ = "tx ring ";
              local_a0._24_8_ = " phy addr:  0x";
              local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)std::hex;
              local_80._M_impl.super__Deque_impl_data._M_map_size = (size_t)local_b8;
              local_a0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c2;
              debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_long_const&>>
                        ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                         ,0xd0,"init_tx",
                         (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_long_&>_>
                          *)local_a0);
              local_a8 = (void *)local_c2._2_8_;
              local_a0._8_8_ = "tx ring ";
              local_a0._24_8_ = " virt addr: 0x";
              local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)std::hex;
              local_80._M_impl.super__Deque_impl_data._M_map_size = (size_t)&local_a8;
              local_a0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c2;
              debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_short_const&>,char_const*>,std::ios_base&(&)(std::ios_base&)>,unsigned_long_const&>>
                        ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                         ,0xd1,"init_tx",
                         (LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_short_&>,_const_char_*>,_std::ios_base_&(&)(std::ios_base_&)>,_const_unsigned_long_&>_>
                          *)local_a0);
              uVar2 = (ulong)(ushort)local_c2._0_2_ * 0x40 + 0x6028;
              if (this->len - 4 < uVar2) goto LAB_001072ca;
              uVar3 = (ulong)(ushort)local_c2._0_2_ * 0x40 + 0x6028;
              if (this->len - 4 < uVar3) goto LAB_001072ab;
              *(uint *)(this->addr + uVar3) = *(uint *)(this->addr + uVar2) & 0xff808080 | 0x40824;
              local_a0._0_8_ = local_c2._2_8_;
              local_a0._8_8_ = (element_type *)0x0;
              local_a0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_a0._24_6_ = 0x200;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
              local_80._M_impl.super__Deque_impl_data._M_map_size = 0;
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map
                        (&local_80,0);
              std::vector<ixy::ixgbe_tx_queue,_std::allocator<ixy::ixgbe_tx_queue>_>::push_back
                        (local_b0,(value_type *)local_a0);
              std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                        (&local_80);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._16_8_);
              }
              local_c2._0_2_ = local_c2._0_2_ + 1;
            } while ((ushort)local_c2._0_2_ < this->num_tx_queues);
          }
          if (0x4a7f < this->len - 4) {
            puVar1 = this->addr;
            puVar1[0x4a80] = '\x01';
            puVar1[0x4a81] = '\0';
            puVar1[0x4a82] = '\0';
            puVar1[0x4a83] = '\0';
            return;
          }
        }
      }
    }
LAB_001072ab:
    __assert_fail("reg <= len - 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                  ,0x1d2,"void ixy::IxgbeDevice::set_reg32(uint64_t, uint32_t)");
  }
LAB_001072ca:
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

inline auto IxgbeDevice::get_reg32(uint64_t reg) -> uint32_t {
    assert(reg <= len - 4);

    __asm__ volatile ("" : : : "memory");
    return *(reinterpret_cast<volatile uint32_t *>(addr + reg));
}